

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_> *
libcellml::getImportedUnits
          (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *__return_storage_ptr__,ModelConstPtr *model)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  UnitsPtr units;
  _func_int **local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    sVar2 = Model::unitsCount((model->
                              super___shared_ptr<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
    if (sVar2 <= uVar3) break;
    Model::units((Model *)&local_30,
                 (size_t)(model->
                         super___shared_ptr<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    bVar1 = ImportedEntity::isImport((ImportedEntity *)(local_30 + 2));
    if (bVar1) {
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_30);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<UnitsPtr> getImportedUnits(const ModelConstPtr &model)
{
    std::vector<UnitsPtr> importedUnits;
    for (size_t i = 0; i < model->unitsCount(); ++i) {
        auto units = model->units(i);
        if (units->isImport()) {
            importedUnits.push_back(units);
        }
    }

    return importedUnits;
}